

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Hint.c
# Opt level: O2

int Llb_ManModelCheckAigWithHints(Aig_Man_t *pAigGlo,Gia_ParLlb_t *pPars)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  abctime aVar3;
  int iVar4;
  long lVar5;
  Vec_Int_t **p_01;
  DdManager *ddGlo;
  abctime local_48;
  Vec_Int_t *vHFCands;
  Vec_Int_t *vHints;
  
  ddGlo = (DdManager *)0x0;
  local_48 = Abc_Clock();
  if (pPars->nHintDepth < 1) {
    __assert_fail("pPars->nHintDepth > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb1Hint.c"
                  ,0xa9,"int Llb_ManModelCheckAigWithHints(Aig_Man_t *, Gia_ParLlb_t *)");
  }
  p = Llb_ManCollectHighFanoutObjects(pAigGlo,pPars->nHintDepth + pPars->HintFirst,1);
  iVar4 = pAigGlo->vObjs->nSize;
  vHFCands = p;
  p_00 = Vec_IntAlloc(iVar4);
  p_00->nSize = iVar4;
  if (p_00->pArray != (int *)0x0) {
    memset(p_00->pArray,0xff,(long)iVar4 << 2);
  }
  iVar2 = -1;
  vHints = p_00;
  for (iVar4 = pPars->HintFirst; iVar4 < p->nSize; iVar4 = iVar4 + 1) {
    iVar2 = Vec_IntEntry(p,iVar4);
    Vec_IntWriteEntry(p_00,iVar2,1);
    iVar2 = Llb_ManModelCheckAig(pAigGlo,pPars,p_00,&ddGlo);
    if (iVar2 == 0) goto LAB_006901fe;
    iVar1 = iVar2;
    if (iVar2 == 1) goto LAB_006901bd;
  }
  iVar1 = iVar2;
  if (iVar2 == -1) {
    iVar2 = -1;
  }
  else {
LAB_006901bd:
    do {
      iVar2 = iVar1;
      if (iVar4 < pPars->HintFirst) break;
      iVar2 = Vec_IntEntry(p,iVar4);
      Vec_IntWriteEntry(p_00,iVar2,-1);
      iVar2 = Llb_ManModelCheckAig(pAigGlo,pPars,p_00,&ddGlo);
      iVar4 = iVar4 + -1;
      iVar1 = 1;
    } while (iVar2 == 1);
  }
LAB_006901fe:
  if (ddGlo != (DdManager *)0x0) {
    if (ddGlo->bFunc != (DdNode *)0x0) {
      Cudd_RecursiveDeref(ddGlo,ddGlo->bFunc);
    }
    Extra_StopManager(ddGlo);
  }
  Vec_IntFreeP(&vHFCands);
  p_01 = &vHints;
  Vec_IntFreeP(p_01);
  iVar4 = (int)p_01;
  if (pPars->fVerbose != 0) {
    aVar3 = Abc_Clock();
    lVar5 = aVar3 - local_48;
    Abc_Print(iVar4,"%s =","Total runtime");
    Abc_Print(iVar4,"%9.2f sec\n",(double)lVar5 / 1000000.0);
  }
  return iVar2;
}

Assistant:

int Llb_ManModelCheckAigWithHints( Aig_Man_t * pAigGlo, Gia_ParLlb_t * pPars )
{
    DdManager * ddGlo = NULL;
    Vec_Int_t * vHints;
    Vec_Int_t * vHFCands;
    int i, Entry, RetValue = -1;
    abctime clk = Abc_Clock();
    assert( pPars->nHintDepth > 0 );
/*
    // perform reachability without hints
    RetValue = Llb_ManModelCheckAig( pAigGlo, pPars, NULL, NULL );
    if ( RetValue >= 0 )
        return RetValue;
*/
    // create hints representation
    vHFCands = Llb_ManCollectHighFanoutObjects( pAigGlo, pPars->nHintDepth+pPars->HintFirst, 1 );
    vHints   = Vec_IntStartFull( Aig_ManObjNumMax(pAigGlo) );
    // add one hint at a time till the problem is solved
    Vec_IntForEachEntryStart( vHFCands, Entry, i, pPars->HintFirst )
    {
        Vec_IntWriteEntry( vHints, Entry, 1 );   // change to 1 to start from zero cof!!!
        // solve under hints
        RetValue = Llb_ManModelCheckAig( pAigGlo, pPars, vHints, &ddGlo );
        if ( RetValue == 0 )
            goto Finish;
        if ( RetValue == 1 )
            break;
    }
    if ( RetValue == -1 )
        goto Finish;
    // undo the hints one at a time
    for ( ; i >= pPars->HintFirst; i-- )
    {
        Entry = Vec_IntEntry( vHFCands, i );
        Vec_IntWriteEntry( vHints, Entry, -1 );        
        // solve under relaxed hints
        RetValue = Llb_ManModelCheckAig( pAigGlo, pPars, vHints, &ddGlo );
        if ( RetValue == 0 )
            goto Finish;
        if ( RetValue == 1 )
            continue;
        break;
    }
Finish:
    if ( ddGlo )
    {
        if ( ddGlo->bFunc )
            Cudd_RecursiveDeref( ddGlo, ddGlo->bFunc ); 
        Extra_StopManager( ddGlo );
    }
    Vec_IntFreeP( &vHFCands );
    Vec_IntFreeP( &vHints );
    if ( pPars->fVerbose )
        Abc_PrintTime( 1, "Total runtime", Abc_Clock() - clk );
    return RetValue;
}